

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleJitProfilingHelpers.cpp
# Opt level: O2

void Js::SimpleJitHelpers::ProfileCall
               (void *framePtr,ProfileId profileId,InlineCacheIndex inlineCacheIndex,Var retval,
               Var callee,CallInfo info)

{
  bool bVar1;
  JavascriptCallStackLayout *pJVar2;
  FunctionBody *this;
  DynamicProfileInfo *this_00;
  JavascriptFunction *calleeFunction;
  FunctionInfo *calleeFunctionInfo;
  
  pJVar2 = JavascriptCallStackLayout::FromFramePointer(framePtr);
  this = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)pJVar2);
  this_00 = FunctionBody::GetDynamicProfileInfo(this);
  bVar1 = VarIs<Js::JavascriptFunction>(callee);
  if (bVar1) {
    calleeFunction = VarTo<Js::JavascriptFunction>(callee);
    if (calleeFunction != (JavascriptFunction *)0x0) {
      calleeFunctionInfo = (calleeFunction->functionInfo).ptr;
      goto LAB_005b2e14;
    }
  }
  calleeFunction = (JavascriptFunction *)0x0;
  calleeFunctionInfo = (FunctionInfo *)0x0;
LAB_005b2e14:
  DynamicProfileInfo::RecordCallSiteInfo
            (this_00,this,profileId,calleeFunctionInfo,calleeFunction,info._0_4_ & 0xffffff,
             (bool)(info._3_1_ & 1),inlineCacheIndex);
  if ((info._0_4_ >> 0x19 & 1) == 0) {
    return;
  }
  DynamicProfileInfo::RecordReturnTypeOnCallSiteInfo(this_00,this,profileId,retval);
  return;
}

Assistant:

void SimpleJitHelpers::ProfileCall(void* framePtr, ProfileId profileId, InlineCacheIndex inlineCacheIndex, Var retval, Var callee, CallInfo info)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(SimpleProfileCall);
        JavascriptFunction* caller = JavascriptCallStackLayout::FromFramePointer(framePtr)->functionObject;

        FunctionBody* callerFunctionBody = caller->GetFunctionBody();
        DynamicProfileInfo * dynamicProfileInfo = callerFunctionBody->GetDynamicProfileInfo();

        JavascriptFunction *const calleeFunction =
            VarIs<JavascriptFunction>(callee) ? VarTo<JavascriptFunction>(callee) : nullptr;
        FunctionInfo* calleeFunctionInfo = calleeFunction ? calleeFunction->GetFunctionInfo() : nullptr;

        auto const ctor = !!(info.Flags & CallFlags_New);
        dynamicProfileInfo->RecordCallSiteInfo(callerFunctionBody, profileId, calleeFunctionInfo, calleeFunction, info.Count, ctor, inlineCacheIndex);

        if (info.Flags & CallFlags_Value)
        {
            dynamicProfileInfo->RecordReturnTypeOnCallSiteInfo(callerFunctionBody, profileId, retval);
        }
        JIT_HELPER_END(SimpleProfileCall);
    }